

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxerManager.cpp
# Opt level: O0

void __thiscall
MuxerManager::checkTrackList(MuxerManager *this,vector<StreamInfo,_std::allocator<StreamInfo>_> *ci)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  __type _Var6;
  reference pSVar7;
  ostream *poVar8;
  VodCoreException *this_00;
  string local_1e8;
  ostringstream local_1b8 [8];
  ostringstream ss;
  StreamInfo *si;
  const_iterator __end1;
  const_iterator __begin1;
  vector<StreamInfo,_std::allocator<StreamInfo>_> *__range1;
  bool mlpFound;
  bool aacFound;
  bool mvcFound;
  bool avcFound;
  vector<StreamInfo,_std::allocator<StreamInfo>_> *ci_local;
  MuxerManager *this_local;
  
  if ((this->m_demuxMode & 1U) == 0) {
    bVar3 = false;
    bVar4 = false;
    bVar1 = false;
    bVar2 = false;
    __end1 = std::vector<StreamInfo,_std::allocator<StreamInfo>_>::begin(ci);
    si = (StreamInfo *)std::vector<StreamInfo,_std::allocator<StreamInfo>_>::end(ci);
    while (bVar5 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_StreamInfo_*,_std::vector<StreamInfo,_std::allocator<StreamInfo>_>_>
                                       *)&si), bVar5) {
      pSVar7 = __gnu_cxx::
               __normal_iterator<const_StreamInfo_*,_std::vector<StreamInfo,_std::allocator<StreamInfo>_>_>
               ::operator*(&__end1);
      _Var6 = std::operator==(&pSVar7->m_codec,&::h264CodecInfo.programName);
      if (_Var6) {
        bVar3 = true;
      }
      else {
        _Var6 = std::operator==(&pSVar7->m_codec,&::h264DepCodecInfo.programName);
        if (_Var6) {
          bVar4 = true;
        }
        else {
          _Var6 = std::operator==(&pSVar7->m_codec,&::aacCodecInfo.programName);
          if (_Var6) {
            bVar1 = true;
          }
          else {
            _Var6 = std::operator==(&pSVar7->m_codec,&::mlpCodecInfo.programName);
            if (_Var6) {
              bVar2 = true;
            }
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<const_StreamInfo_*,_std::vector<StreamInfo,_std::allocator<StreamInfo>_>_>::
      operator++(&__end1);
    }
    if ((this->m_bluRayMode & 1U) != 0) {
      if (bVar1) {
        poVar8 = std::operator<<((ostream *)&std::cerr,
                                 "Warning! AAC codec is not standard for BD disks, the disk will not play in a Blu-ray player."
                                );
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        sLastMsg = true;
      }
      else if (((this->m_bluRayMode & 1U) == 0) || (!bVar2)) {
        if (((this->m_bluRayMode & 1U) != 0) &&
           (((V3_flags & 4U) != 0 && ((V3_flags & 0x40U) == 0)))) {
          poVar8 = std::operator<<((ostream *)&std::cerr,
                                   "Warning! Dolby Vision Double Layer Single Tracks are not standard for BD disks, the disk will not play in a Blu-ray player."
                                  );
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          sLastMsg = true;
        }
      }
      else {
        poVar8 = std::operator<<((ostream *)&std::cerr,
                                 "Warning! MLP codec is not standard for BD disks, the disk will not play in a Blu-ray player."
                                );
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        sLastMsg = true;
      }
    }
    if ((!bVar3) && (bVar4)) {
      std::__cxx11::ostringstream::ostringstream(local_1b8);
      std::operator<<((ostream *)local_1b8,
                      "Fatal error: MVC depended view track can\'t be muxed without AVC base view track"
                     );
      this_00 = (VodCoreException *)__cxa_allocate_exception(0x28);
      std::__cxx11::ostringstream::str();
      VodCoreException::VodCoreException(this_00,0x1f8,&local_1e8);
      __cxa_throw(this_00,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
  }
  return;
}

Assistant:

void MuxerManager::checkTrackList(const vector<StreamInfo>& ci) const
{
    if (m_demuxMode)
        return;

    bool avcFound = false;
    bool mvcFound = false;
    bool aacFound = false;
    bool mlpFound = false;

    for (const StreamInfo& si : ci)
    {
        if (si.m_codec == h264CodecInfo.programName)
            avcFound = true;
        else if (si.m_codec == h264DepCodecInfo.programName)
            mvcFound = true;
        else if (si.m_codec == aacCodecInfo.programName)
            aacFound = true;
        else if (si.m_codec == mlpCodecInfo.programName)
            mlpFound = true;
    }

    if (m_bluRayMode)
    {
        if (aacFound)
            LTRACE(LT_ERROR, 2,
                   "Warning! AAC codec is not standard for BD disks, the disk will not play in a Blu-ray player.");
        else if (m_bluRayMode && mlpFound)
            LTRACE(LT_ERROR, 2,
                   "Warning! MLP codec is not standard for BD disks, the disk will not play in a Blu-ray player.");
        else if (m_bluRayMode && (V3_flags & DV) && !(V3_flags & BL_TRACK))
            LTRACE(LT_ERROR, 2,
                   "Warning! Dolby Vision Double Layer Single Tracks are not standard for BD disks, the disk will "
                   "not play in a Blu-ray player.");
    }
    if (!avcFound && mvcFound)
        THROW(ERR_INVALID_STREAMS_SELECTED,
              "Fatal error: MVC depended view track can't be muxed without AVC base view track")
}